

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  JunitReporter *this_local;
  
  (this->super_CumulativeReporterBase).super_IStreamingReporter._vptr_IStreamingReporter =
       (_func_int **)&PTR__JunitReporter_003e7768;
  std::__cxx11::string::~string((string *)&this->stdErrForSuite);
  std::__cxx11::string::~string((string *)&this->stdOutForSuite);
  XmlWriter::~XmlWriter(&this->xml);
  CumulativeReporterBase::~CumulativeReporterBase(&this->super_CumulativeReporterBase);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}